

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O1

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForFreeVarAndRangeRow_Test::TestBody
          (LPTestFeasibility_IsFeasibleForFreeVarAndRangeRow_Test *this)

{
  LP *this_00;
  long lVar1;
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  initializer_list<fizplex::DVector> __l;
  initializer_list<double> l_02;
  initializer_list<double> l_03;
  initializer_list<fizplex::DVector> __l_00;
  allocator_type local_b9;
  vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> local_b8;
  DVector local_a0;
  DVector local_88;
  DVector local_70;
  double local_58 [3];
  undefined1 *puStack_40;
  double local_38 [3];
  
  this_00 = &(this->super_LPTestFeasibility).lp;
  LP::add_column(this_00,Free,-INFINITY,INFINITY,0.0);
  LP::add_row(this_00,Range,-5.0,5.0);
  LP::add_value(this_00,0,0,1.0);
  LP::add_logicals(this_00);
  local_38[0] = 0.0;
  local_38[1] = 5.0;
  l._M_len = 2;
  l._M_array = local_38;
  DVector::DVector(&local_a0,l);
  local_58[2] = -5.0;
  puStack_40 = (undefined1 *)0x4024000000000000;
  l_00._M_len = 2;
  l_00._M_array = local_58 + 2;
  DVector::DVector(&local_88,l_00);
  local_58[0] = 5.0;
  local_58[1] = 0.0;
  l_01._M_len = 2;
  l_01._M_array = local_58;
  DVector::DVector(&local_70,l_01);
  __l._M_len = 3;
  __l._M_array = &local_a0;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector(&local_b8,__l,&local_b9);
  LPTestFeasibility::check_feasible(&this->super_LPTestFeasibility,true,&local_b8);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector(&local_b8);
  lVar1 = 0x48;
  do {
    operator_delete(*(void **)((long)&local_b8.
                                      super__Vector_base<fizplex::DVector,_std::allocator<fizplex::DVector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0);
  local_38[0] = -6.0;
  local_38[1] = 1.0;
  l_02._M_len = 2;
  l_02._M_array = local_38;
  DVector::DVector(&local_a0,l_02);
  local_58[2] = 6.0;
  puStack_40 = &DAT_bff0000000000000;
  l_03._M_len = 2;
  l_03._M_array = local_58 + 2;
  DVector::DVector(&local_88,l_03);
  __l_00._M_len = 2;
  __l_00._M_array = &local_a0;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector
            (&local_b8,__l_00,(allocator_type *)local_58);
  LPTestFeasibility::check_feasible(&this->super_LPTestFeasibility,false,&local_b8);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector(&local_b8);
  lVar1 = 0x30;
  do {
    operator_delete(*(void **)((long)&local_b8.
                                      super__Vector_base<fizplex::DVector,_std::allocator<fizplex::DVector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != 0);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForFreeVarAndRangeRow) {
  lp.add_column(ColType::Free, -inf, inf);
  lp.add_row(RowType::Range, -5, 5);
  lp.add_value(0, 0, 1.0);
  lp.add_logicals();

  check_feasible(true, {{0, 5}, {-5, 10}, {5, 0}});
  check_feasible(false, {{-6, 1}, {6, -1}});
}